

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Permutahedral_representation_iterators.h
# Opt level: O0

void __thiscall
Gudhi::coxeter_triangulation::
Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::Coface_iterator(Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
                  *this,Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *simplex,uint *l)

{
  uint uVar1;
  uint uVar2;
  Vertex *this_00;
  size_type sVar3;
  size_t sVar4;
  OrderedSetPartition *pOVar5;
  ulong uVar6;
  reference pvVar7;
  reference pvVar8;
  reference this_01;
  const_reference pvVar9;
  uint local_94;
  size_type local_90;
  uint local_84;
  uint local_80;
  uint i;
  uint j;
  allocator<int> local_59;
  vector<int,_std::allocator<int>_> local_58;
  Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_30;
  uint local_28;
  uint local_24;
  uint *local_20;
  uint *l_local;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *simplex_local;
  Coface_iterator<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  *this_local;
  
  local_20 = l;
  l_local = (uint *)simplex;
  simplex_local = &this->simplex_;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::Permutahedral_representation(&this->simplex_,simplex);
  this_00 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::vertex((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      *)l_local);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(this_00);
  this->d_ = (uint)sVar3;
  this->l_ = *local_20;
  sVar4 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          ::dimension((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       *)l_local);
  this->k_ = (uint)sVar4;
  local_24 = this->l_ - this->k_;
  local_28 = this->k_ + 1;
  pOVar5 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ::partition((Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)l_local);
  Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::Size_range(&local_30,pOVar5);
  Integer_combination_iterator::
  Integer_combination_iterator<Gudhi::coxeter_triangulation::Size_range<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
            (&this->i_it_,&local_24,&local_28,&local_30);
  Integer_combination_iterator::Integer_combination_iterator(&this->i_end_);
  std::
  vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,_std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>_>
  ::vector(&this->o_its_);
  Ordered_set_partition_iterator::Ordered_set_partition_iterator(&this->o_end_);
  this->is_end_ = this->l_ < this->k_;
  uVar1 = this->d_;
  std::allocator<int>::allocator(&local_59);
  std::vector<int,_std::allocator<int>_>::vector(&local_58,(ulong)uVar1,&local_59);
  uVar2 = this->l_;
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             ((long)&i + 3));
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)&j,(ulong)(uVar2 + 1),
           (allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)((long)&i + 3))
  ;
  Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::Permutahedral_representation(&this->value_,&local_58,(OrderedSetPartition *)&j);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&j);
  std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::~allocator
            ((allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             ((long)&i + 3));
  std::vector<int,_std::allocator<int>_>::~vector(&local_58);
  std::allocator<int>::~allocator(&local_59);
  local_80 = 0;
  do {
    uVar6 = (ulong)local_80;
    pOVar5 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::partition(&this->simplex_);
    pvVar7 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](pOVar5,(ulong)this->k_);
    sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar7);
    if (sVar3 <= uVar6) {
LAB_001b4a88:
      uVar6 = (ulong)local_80;
      pOVar5 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::partition(&this->simplex_);
      pvVar7 = std::
               vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ::operator[](pOVar5,(ulong)this->k_);
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar7);
      if (uVar6 == sVar3) {
        std::operator<<((ostream *)&std::cerr,
                        "Coface iterator: the argument simplex is not a permutahedral representation\n"
                       );
        this->is_end_ = true;
      }
      else {
        for (local_84 = 0; local_84 < this->k_ + 1; local_84 = local_84 + 1) {
          pOVar5 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                   ::partition(&this->simplex_);
          pvVar7 = std::
                   vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ::operator[](pOVar5,(ulong)local_84);
          local_90 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar7);
          this_01 = boost::iterators::detail::
                    iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
                    ::operator*((iterator_facade_base<Gudhi::coxeter_triangulation::Integer_combination_iterator,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_boost::iterators::forward_traversal_tag,_const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_&,_long,_false,_false>
                                 *)&this->i_it_);
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (this_01,(ulong)local_84);
          local_94 = *pvVar9 + 1;
          std::
          vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>>
          ::emplace_back<unsigned_long,unsigned_int>
                    ((vector<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator,std::allocator<Gudhi::coxeter_triangulation::Ordered_set_partition_iterator>>
                      *)&this->o_its_,&local_90,&local_94);
        }
        update_value(this);
      }
      return;
    }
    pOVar5 = Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::partition(&this->simplex_);
    pvVar7 = std::
             vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ::operator[](pOVar5,(ulong)this->k_);
    pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (pvVar7,(ulong)local_80);
    if (*pvVar8 == (ulong)this->d_) {
      this->t_ = local_80;
      goto LAB_001b4a88;
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

Coface_iterator(const Permutahedral_representation& simplex, const uint& l)
      : simplex_(simplex),
        d_(simplex.vertex().size()),
        l_(l),
        k_(simplex.dimension()),
        i_it_(l_ - k_, k_ + 1, Size_range<Ordered_partition>(simplex.partition())),
        is_end_(k_ > l_),
        value_({Vertex(d_), Ordered_partition(l_ + 1)}) {
    uint j = 0;
    for (; j < simplex_.partition()[k_].size(); j++)
      if (simplex_.partition()[k_][j] == d_) {
        t_ = j;
        break;
      }
    if (j == simplex_.partition()[k_].size()) {
      std::cerr << "Coface iterator: the argument simplex is not a permutahedral representation\n";
      is_end_ = true;
      return;
    }
    for (uint i = 0; i < k_ + 1; i++)
      o_its_.emplace_back(simplex_.partition()[i].size(), (*i_it_)[i] + 1);
    update_value();
  }